

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O2

int sock_read(BIO *b,char *out,int outl)

{
  int iVar1;
  ssize_t sVar2;
  int return_value;
  
  if (out == (char *)0x0) {
    return_value = 0;
  }
  else {
    bio_clear_socket_error();
    sVar2 = read(b->num,out,(long)outl);
    return_value = (int)sVar2;
    BIO_clear_retry_flags(b);
    if (return_value < 1) {
      iVar1 = bio_socket_should_retry(return_value);
      if (iVar1 != 0) {
        BIO_set_retry_read(b);
      }
    }
  }
  return return_value;
}

Assistant:

static int sock_read(BIO *b, char *out, int outl) {
  if (out == NULL) {
    return 0;
  }

  bio_clear_socket_error();
#if defined(OPENSSL_WINDOWS)
  int ret = recv(b->num, out, outl, 0);
#else
  int ret = (int)read(b->num, out, outl);
#endif
  BIO_clear_retry_flags(b);
  if (ret <= 0) {
    if (bio_socket_should_retry(ret)) {
      BIO_set_retry_read(b);
    }
  }
  return ret;
}